

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Own<capnp::ClientHook> __thiscall
capnp::QueuedPipeline::getPipelinedCap(QueuedPipeline *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  size_t in_RCX;
  ClientHook *extraout_RDX;
  long lVar1;
  Own<capnp::ClientHook> OVar2;
  Array<capnp::PipelineOp> result;
  ArrayBuilder<capnp::PipelineOp> local_58;
  Array<capnp::PipelineOp> local_38;
  
  local_38.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<capnp::PipelineOp>(in_RCX);
  local_58.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  for (lVar1 = 0; in_RCX << 3 != lVar1; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)&(local_38.ptr)->type + lVar1) = *(undefined8 *)(ops.size_ + lVar1);
  }
  local_38.size_ = lVar1 >> 3;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_58.ptr = (PipelineOp *)0x0;
  local_58.pos = (RemoveConst<capnp::PipelineOp> *)0x0;
  local_58.endPtr = (PipelineOp *)0x0;
  getPipelinedCap(this,(Array<capnp::PipelineOp> *)ops.ptr);
  kj::Array<capnp::PipelineOp>::~Array(&local_38);
  kj::ArrayBuilder<capnp::PipelineOp>::dispose(&local_58);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<ClientHook> getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) override {
    auto copy = kj::heapArrayBuilder<PipelineOp>(ops.size());
    for (auto& op: ops) {
      copy.add(op);
    }
    return getPipelinedCap(copy.finish());
  }